

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cpp
# Opt level: O1

bool __thiscall common_arg::get_value_from_env(common_arg *this,string *output)

{
  char *pcVar1;
  char *__s;
  
  if (this->env != (char *)0x0) {
    __s = getenv(this->env);
    if (__s != (char *)0x0) {
      pcVar1 = (char *)output->_M_string_length;
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)output,0,pcVar1,(ulong)__s);
    }
    return __s != (char *)0x0;
  }
  return false;
}

Assistant:

bool common_arg::get_value_from_env(std::string & output) {
    if (env == nullptr) return false;
    char * value = std::getenv(env);
    if (value) {
        output = value;
        return true;
    }
    return false;
}